

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascon_aead80pq.c
# Opt level: O0

_Bool ascon_aead80pq_decrypt
                (uint8_t *plaintext,uint8_t *key,uint8_t *nonce,uint8_t *assoc_data,
                uint8_t *ciphertext,uint8_t *expected_tag,size_t assoc_data_len,
                size_t ciphertext_len,size_t expected_tag_len)

{
  size_t new_pt_bytes;
  _Bool is_tag_valid;
  ascon_aead_ctx_t ctx;
  uint8_t *in_stack_ffffffffffffff68;
  undefined7 in_stack_ffffffffffffff70;
  byte in_stack_ffffffffffffff77;
  uint8_t *in_stack_ffffffffffffff78;
  ascon_aead_ctx_t *in_stack_ffffffffffffff80;
  uint8_t *in_stack_ffffffffffffff88;
  ascon_aead_ctx_t *in_stack_ffffffffffffff90;
  
  ascon_aead80pq_init((ascon_aead_ctx_t *)
                      CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),
                      in_stack_ffffffffffffff68,(uint8_t *)0x104820);
  ascon_aead80pq_assoc_data_update
            ((ascon_aead_ctx_t *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),
             in_stack_ffffffffffffff68,0x104837);
  ascon_aead80pq_decrypt_update
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
             (uint8_t *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),
             (size_t)in_stack_ffffffffffffff68);
  ascon_aead80pq_decrypt_final
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,(_Bool *)in_stack_ffffffffffffff80,
             in_stack_ffffffffffffff78,CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70)
            );
  return (_Bool)(in_stack_ffffffffffffff77 & 1);
}

Assistant:

ASCON_API bool
ascon_aead80pq_decrypt(uint8_t* plaintext,
                       const uint8_t key[ASCON_AEAD80pq_KEY_LEN],
                       const uint8_t nonce[ASCON_AEAD_NONCE_LEN],
                       const uint8_t* assoc_data,
                       const uint8_t* ciphertext,
                       const uint8_t* expected_tag,
                       size_t assoc_data_len,
                       size_t ciphertext_len,
                       size_t expected_tag_len)
{
    ASCON_ASSERT(ciphertext_len == 0 || plaintext != NULL);
    ASCON_ASSERT(key != NULL);
    ASCON_ASSERT(nonce != NULL);
    ASCON_ASSERT(assoc_data_len == 0 || assoc_data != NULL);
    ASCON_ASSERT(ciphertext_len == 0 || ciphertext != NULL);
    ASCON_ASSERT(expected_tag_len != 0 || expected_tag != NULL);
    ascon_aead_ctx_t ctx;
    bool is_tag_valid;
    ascon_aead80pq_init(&ctx, key, nonce);
    ascon_aead80pq_assoc_data_update(&ctx, assoc_data, assoc_data_len);
    const size_t new_pt_bytes = ascon_aead80pq_decrypt_update(&ctx,
                                                              plaintext,
                                                              ciphertext,
                                                              ciphertext_len);
    ascon_aead80pq_decrypt_final(&ctx, plaintext + new_pt_bytes,
                                 &is_tag_valid, expected_tag, expected_tag_len);
    return is_tag_valid;
}